

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

ssize_t __thiscall
Json::FastWriter::write_abi_cxx11_(FastWriter *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  undefined4 in_register_00000034;
  FastWriter *this_00;
  
  this_00 = (FastWriter *)CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::_M_replace
            ((ulong)&this_00->document_,0,(char *)(this_00->document_)._M_string_length,0x128233);
  writeValue(this_00,(Value *)__buf);
  if (this_00->omitEndingLineFeed_ == false) {
    std::__cxx11::string::append((char *)&this_00->document_);
  }
  (this->super_Writer)._vptr_Writer = (_func_int **)&(this->document_)._M_string_length;
  pcVar1 = (this_00->document_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (this_00->document_)._M_string_length);
  return (ssize_t)this;
}

Assistant:

std::string FastWriter::write(const Value& root) {
  document_ = "";
  writeValue(root);
  if (!omitEndingLineFeed_)
    document_ += "\n";
  return document_;
}